

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Access_block_grid64(int g_a,int64_t *index,void *ptr,int64_t *ld)

{
  Integer IVar1;
  long lVar2;
  long lVar3;
  int64_t *piVar4;
  Integer _ga_work [7];
  Integer _ga_lo [7];
  Integer local_a8 [7];
  int64_t iStack_70;
  Integer local_68 [8];
  
  IVar1 = pnga_ndim((long)g_a);
  lVar2 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  piVar4 = &iStack_70 + IVar1;
  for (; lVar3 != lVar2; lVar2 = lVar2 + 1) {
    *piVar4 = index[lVar2];
    piVar4 = piVar4 + -1;
  }
  pnga_access_block_grid_ptr((long)g_a,local_68,ptr,local_a8);
  lVar2 = 0;
  lVar3 = IVar1 + -1;
  if (IVar1 + -1 < 1) {
    lVar3 = lVar2;
  }
  piVar4 = ld + IVar1 + -2;
  for (; lVar3 != lVar2; lVar2 = lVar2 + 1) {
    *piVar4 = local_a8[lVar2];
    piVar4 = piVar4 + -1;
  }
  return;
}

Assistant:

void NGA_Access_block_grid64(int g_a, int64_t index[], void *ptr, int64_t ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM], _ga_work[MAXDIM];
     COPYC2F(index, _ga_lo, ndim);
     wnga_access_block_grid_ptr(a,_ga_lo,ptr,_ga_work);
     COPYF2C_64(_ga_work,ld, ndim-1);
}